

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void flatview_add_to_dispatch_sparc
               (uc_struct_conflict8 *uc,FlatView *fv,MemoryRegionSection *section)

{
  long lVar1;
  uint16_t leaf;
  MemoryRegionSection *extraout_RDX;
  FlatRange *pFVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t r;
  ulong uVar5;
  ulong uVar6;
  uint64_t r_1;
  FlatRange *pFVar7;
  ulong uVar8;
  MemoryRegionSection remain;
  MemoryRegionSection now;
  undefined1 local_c8 [24];
  MemoryRegionSection *pMStack_b0;
  MemoryRegion *local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uc_struct_conflict8 *local_88;
  AddressSpaceDispatch *local_80;
  undefined1 local_78 [24];
  MemoryRegionSection *pMStack_60;
  MemoryRegion *local_58;
  hwaddr hStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar3 = (ulong)section->size;
  pFVar2 = *(FlatRange **)((long)&section->size + 8);
  local_c8._16_8_ = section->mr;
  pMStack_b0 = (MemoryRegionSection *)section->fv;
  local_a8 = (MemoryRegion *)section->offset_within_region;
  uVar4 = section->offset_within_address_space;
  local_98 = *(undefined8 *)&section->readonly;
  uStack_90 = *(undefined8 *)&section->field_0x38;
  if ((uVar4 & 0xfff) != 0) {
    uVar5 = (uVar4 + 0xfff & 0xfffffffffffff000) - uVar4;
    uVar6 = (ulong)section->size;
    pFVar7 = *(FlatRange **)((long)&section->size + 8);
    local_78._16_8_ = section->mr;
    pMStack_60 = (MemoryRegionSection *)section->fv;
    local_58 = (MemoryRegion *)section->offset_within_region;
    hStack_50 = section->offset_within_address_space;
    local_48 = *(undefined8 *)&section->readonly;
    uStack_40 = *(undefined8 *)&section->field_0x38;
    uVar8 = (ulong)(uVar5 < uVar6);
    lVar1 = -(long)pFVar7;
    if (lVar1 < (long)uVar8) {
      pFVar7 = (FlatRange *)0x0;
      uVar6 = uVar5;
    }
    local_c8._0_8_ = uVar3;
    local_c8._8_8_ = pFVar2;
    uStack_a0 = uVar4;
    local_78._0_8_ = uVar6;
    local_78._8_8_ = pFVar7;
    register_subpage((uc_struct_conflict8 *)fv,(FlatView *)local_78,
                     (MemoryRegionSection *)(lVar1 - uVar8));
    if ((FlatRange *)local_c8._8_8_ == pFVar7 && local_c8._0_8_ == uVar6) {
      return;
    }
    uVar3 = local_c8._0_8_ - uVar6;
    pFVar2 = (FlatRange *)
             (local_c8._8_8_ + (-(ulong)((ulong)local_c8._0_8_ < uVar6) - (long)pFVar7));
    local_c8._0_8_ = uVar3;
    local_c8._8_8_ = pFVar2;
    if (pFVar7 != (FlatRange *)0x0) goto LAB_009bf5e3;
    uVar4 = uVar4 + uVar6;
    local_a8 = (MemoryRegion *)(&local_a8->ram + uVar6);
    section = extraout_RDX;
  }
  local_c8._0_8_ = uVar3;
  local_c8._8_8_ = pFVar2;
  uStack_a0 = uVar4;
  if ((long)pFVar2 < (long)(ulong)(uVar3 < 0x1000)) {
LAB_009bf5c4:
    register_subpage((uc_struct_conflict8 *)fv,(FlatView *)local_c8,section);
    return;
  }
  local_48 = local_98;
  uStack_40 = uStack_90;
  local_58 = local_a8;
  local_78._16_8_ = local_c8._16_8_;
  pMStack_60 = pMStack_b0;
  uVar8 = uVar3 & 0xfffffffffffff000;
  local_80 = fv->dispatch;
  local_88 = (uc_struct_conflict8 *)fv;
  local_78._0_8_ = uVar8;
  local_78._8_8_ = pFVar2;
  hStack_50 = uVar4;
  leaf = phys_section_add((uc_struct_conflict8 *)&local_80->map,(PhysPageMap *)local_78,section);
  if ((long)pFVar2 >> 0xc == 0) {
    uVar6 = uVar3 >> 0xc | (long)pFVar2 << 0x34;
    if (uVar6 == 0) {
      __assert_fail("num_pages",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x38d,
                    "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)"
                   );
    }
    phys_page_set(local_80,uVar4 >> 0xc,uVar6,leaf);
    if (uVar3 == uVar8) {
      return;
    }
    local_c8._0_8_ = uVar3 - uVar8;
    local_c8._8_8_ = -(ulong)(uVar3 < uVar8);
    if (pFVar2 == (FlatRange *)0x0) {
      uStack_a0 = uVar4 + uVar8;
      local_a8 = (MemoryRegion *)(&local_a8->ram + uVar8);
      section = (MemoryRegionSection *)0x0;
      fv = (FlatView *)local_88;
      goto LAB_009bf5c4;
    }
  }
LAB_009bf5e3:
  __assert_fail("r == a",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                ,0x16,"uint64_t int128_get64(Int128)");
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}